

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O0

void hdpc_generate_mat_specexact(m256v *H,parameters *P)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long in_RSI;
  int i_1;
  m256v I_H;
  m256v G_HDPC;
  int j_2;
  int i;
  m256v GAMMA;
  uint8_t *gamma;
  int d;
  int j_1;
  uint8_t val;
  uint32_t b;
  uint32_t a;
  int j;
  m256v MT;
  uint8_t *mt;
  int local_a4;
  undefined7 in_stack_ffffffffffffff60;
  uint8_t in_stack_ffffffffffffff67;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  m256v *in_stack_ffffffffffffff80;
  int local_70;
  int local_6c;
  m256v local_68;
  uint8_t *local_50;
  int local_48;
  int local_44;
  uint8_t local_3d;
  uint local_3c;
  uint32_t local_38;
  int local_34;
  m256v local_30;
  uint8_t *local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = (uint8_t *)
             malloc((long)(*(int *)(in_RSI + 0x14) *
                          (*(int *)(in_RSI + 4) + *(int *)(in_RSI + 0x10))));
  m256v_make(&local_30,*(int *)(local_10 + 0x14),*(int *)(local_10 + 4) + *(int *)(local_10 + 0x10),
             local_18);
  m256v_clear((m256v *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  for (local_34 = 0; local_34 < *(int *)(local_10 + 4) + *(int *)(local_10 + 0x10) + -1;
      local_34 = local_34 + 1) {
    uVar1 = Rand(local_34 + 1,6,*(int *)(local_10 + 0x14));
    local_38 = uVar1;
    uVar2 = Rand(local_34 + 1,7,*(int *)(local_10 + 0x14) + -1);
    local_3c = (uVar1 + uVar2 + 1) % *(uint *)(local_10 + 0x14);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67);
  }
  local_3d = '\x01';
  for (local_44 = 0; local_44 < *(int *)(local_10 + 0x14); local_44 = local_44 + 1) {
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67);
    local_3d = gf256_mul('\0','\0');
  }
  local_48 = *(int *)(local_10 + 4) + *(int *)(local_10 + 0x10);
  local_50 = (uint8_t *)malloc((long)(local_48 * local_48));
  m256v_make(&local_68,local_48,local_48,local_50);
  m256v_clear((m256v *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  local_3d = '\x01';
  for (local_6c = 0; local_6c < local_48; local_6c = local_6c + 1) {
    for (local_70 = local_6c; local_70 < local_48; local_70 = local_70 + 1) {
      m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67);
    }
    local_3d = gf256_mul('\0','\0');
  }
  m256v_get_subview(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                    in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  m256v_mul(in_stack_ffffffffffffff80,
            (m256v *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
            (m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  m256v_get_subview(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                    in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  m256v_clear((m256v *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  for (local_a4 = 0; local_a4 < *(int *)(local_10 + 0x14); local_a4 = local_a4 + 1) {
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67);
  }
  free(local_50);
  free(local_18);
  return;
}

Assistant:

void hdpc_generate_mat_specexact(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create the MT matrix */
	uint8_t* mt = malloc(P->H * (P->Kprime + P->S));
	m256v MT = m256v_make(P->H, P->Kprime + P->S, mt);
	m256v_clear(&MT);
	for (int j = 0; j < P->Kprime + P->S - 1; ++j) {
		uint32_t a = Rand(j + 1, 6, P->H);
		uint32_t b = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&MT, a, j, 1);
		m256v_set_el(&MT, b, j, 1);
	}
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&MT, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}

	/* Create the GAMMA matrix */
	const int d = P->Kprime + P->S;
	uint8_t* gamma = malloc(d * d);
	m256v GAMMA = m256v_make(d, d, gamma);
	m256v_clear(&GAMMA);

	val = 1;
	for (int i = 0; i < d; ++i) {
		for (int j = i; j < d; ++j) {
			m256v_set_el(&GAMMA, j, j - i, val);
		}
		val = gf256_mul(val, 2);
	}

	/* Place the product MT * GAMMA into the G_HDPC matrix */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	m256v_mul(&MT, &GAMMA, &G_HDPC);

	/* Write the diagonal matrix I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}

	/* Free temp space */
	free(gamma);
	free(mt);
}